

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRenderRule * __thiscall
QStyleSheetStyle::renderRule
          (QRenderRule *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj,QStyleOption *opt
          ,int pseudoElement)

{
  ColorGroup CVar1;
  bool bVar2;
  int iVar3;
  QStyleOption *pQVar4;
  QLineEdit *this_00;
  QFrame *this_01;
  quint64 qVar5;
  QPlainTextEdit *this_02;
  QTextEdit *this_03;
  uint uVar6;
  ulong uVar7;
  QStyleOption *pQVar8;
  uint uVar9;
  QFlagsStorage<QStyle::StateFlag> state;
  uint uVar10;
  ulong uVar11;
  
  if (opt == (QStyleOption *)0x0) {
    state.i = 0;
LAB_00354535:
    pQVar4 = (QStyleOption *)0x0;
  }
  else {
    state.i = (opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
    if ((opt->version < 1) || (pQVar4 = opt, opt->type < 0xf0000)) goto LAB_00354535;
  }
  if (pQVar4 == (QStyleOption *)0x0) {
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar4 = opt, opt->type != 4)) {
      pQVar4 = (QStyleOption *)0x0;
    }
    if (pQVar4 == (QStyleOption *)0x0) {
      if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar4 = opt, opt->type != 8)) {
        pQVar4 = (QStyleOption *)0x0;
      }
      if (pQVar4 == (QStyleOption *)0x0) {
        if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar4 = opt, opt->type != 0xb)
           ) {
          pQVar4 = (QStyleOption *)0x0;
        }
        if (pQVar4 == (QStyleOption *)0x0) {
          if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar4 = opt, opt->type != 3)
             ) {
            pQVar4 = (QStyleOption *)0x0;
          }
          if (pQVar4 == (QStyleOption *)0x0) {
            if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
               (pQVar4 = opt, opt->type != 2)) {
              pQVar4 = (QStyleOption *)0x0;
            }
            if (pQVar4 == (QStyleOption *)0x0) {
              if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
                 (pQVar4 = opt, opt->type != 5)) {
                pQVar4 = (QStyleOption *)0x0;
              }
              if (pQVar4 == (QStyleOption *)0x0) {
                if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
                   (pQVar4 = opt, opt->type != 0xe)) {
                  pQVar4 = (QStyleOption *)0x0;
                }
                if (pQVar4 == (QStyleOption *)0x0) {
                  if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
                     (pQVar4 = opt, opt->type != 7)) {
                    pQVar4 = (QStyleOption *)0x0;
                  }
                  if (pQVar4 == (QStyleOption *)0x0) {
                    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
                       (pQVar4 = opt, opt->type != 9)) {
                      pQVar4 = (QStyleOption *)0x0;
                    }
                    if (pQVar4 == (QStyleOption *)0x0) {
                      if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 10))
                      {
                        opt = (QStyleOption *)0x0;
                      }
                      if (opt == (QStyleOption *)0x0) {
                        this_02 = (QPlainTextEdit *)
                                  QMetaObject::cast((QObject *)&QPlainTextEdit::staticMetaObject);
                        if (this_02 == (QPlainTextEdit *)0x0) {
                          this_03 = (QTextEdit *)
                                    QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
                          if (this_03 == (QTextEdit *)0x0) goto LAB_00354baa;
                          bVar2 = QTextEdit::isReadOnly(this_03);
                        }
                        else {
                          bVar2 = QPlainTextEdit::isReadOnly(this_02);
                        }
                        uVar11 = 0x8000000000;
                        if (bVar2 != false) {
                          uVar11 = 0x40000000;
                        }
                      }
                      else {
                        uVar11 = (ulong)(*(uint *)((long)&opt[1].palette.d + 4) & 2) << 0x2b;
                        switch(opt[3].version) {
                        case 1:
                          goto switchD_00354a63_caseD_0;
                        case 2:
                          goto switchD_00354a63_caseD_1;
                        case 3:
                          goto switchD_00354a63_caseD_2;
                        case 4:
                          goto switchD_00354a63_caseD_3;
                        }
                      }
                    }
                    else {
                      uVar11 = ((ulong)*(byte *)((long)&pQVar4[1].rect.x2.m_i + 1) << 0x21) +
                               ((ulong)*(byte *)((long)&pQVar4[1].rect.x2.m_i + 2) << 0x22 |
                               (ulong)(byte)pQVar4[1].rect.x2.m_i << 0x20 |
                               (ulong)*(byte *)((long)&pQVar4[1].rect.x2.m_i + 3) << 10) + 0x400;
                    }
                  }
                  else {
                    if ((ulong)*(uint *)&pQVar4[1].fontMetrics < 4) {
                      uVar11 = *(ulong *)(&DAT_00680b68 + (ulong)*(uint *)&pQVar4[1].fontMetrics * 8
                                         );
                    }
                    else {
                      uVar11 = 0;
                    }
                    if (*(int *)&pQVar4[1].field_0x24 == 2) goto LAB_00354ae1;
                    if (*(int *)&pQVar4[1].field_0x24 == 1) goto LAB_00354ad5;
                  }
                }
                else {
                  uVar6 = pQVar4[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                          super_QFlagsStorage<QStyle::StateFlag>.i - 1;
                  if (uVar6 < 8) {
                    uVar11 = *(ulong *)(&DAT_0067feb8 + (ulong)uVar6 * 8);
                  }
                  else {
                    uVar11 = 0;
                  }
                  switch(pQVar4[1].type) {
                  case 0:
switchD_00354a63_caseD_0:
                    uVar11 = uVar11 | 0x10000;
                    break;
                  case 1:
switchD_00354a63_caseD_1:
                    uVar11 = uVar11 | 0x40000;
                    break;
                  case 2:
switchD_00354a63_caseD_2:
                    uVar11 = uVar11 | 0x20000;
                    break;
                  case 3:
switchD_00354a63_caseD_3:
                    uVar11 = uVar11 | 0x80000;
                  }
                }
              }
              else {
                uVar11 = (ulong)((pQVar4[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                                  super_QFlagsStorage<QStyle::StateFlag>.i & 1) << 0x16 |
                                (uint)(pQVar4[1].version == 0) << 0x1d);
              }
            }
            else {
              uVar11 = (ulong)((pQVar4[1].version & 4U) << 0xd | (pQVar4[1].version & 1U) << 0x16);
            }
          }
          else {
            uVar11 = (ulong)*(uint *)((long)&pQVar4[1].palette.d + 4);
            if (uVar11 < 4) {
              uVar11 = *(ulong *)(&DAT_00680b68 + uVar11 * 8);
            }
            else {
              uVar11 = 0;
            }
            CVar1 = pQVar4[1].palette.currentGroup;
            if (CVar1 == Inactive) {
              uVar11 = uVar11 | 0x100000;
            }
            else if (CVar1 == Disabled) {
              uVar11 = uVar11 | 0x200000;
            }
            switch(pQVar4[1].version) {
            case 0:
            case 4:
              uVar11 = uVar11 | 0x2000000;
              break;
            case 1:
            case 5:
              uVar11 = uVar11 | 0x4000000;
              break;
            case 2:
            case 6:
              uVar11 = uVar11 | 0x800000;
              break;
            case 3:
            case 7:
              uVar11 = uVar11 | 0x1000000;
            }
          }
        }
        else {
          uVar11 = (ulong)pQVar4[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                          super_QFlagsStorage<QStyle::StateFlag>.i;
          if (uVar11 < 8) {
            uVar11 = *(ulong *)(&DAT_0067fe78 + uVar11 * 8);
          }
          else {
LAB_00354baa:
            uVar11 = 0;
          }
        }
      }
      else {
        uVar11 = (ulong)*(uint *)&pQVar4[1].palette.field_0xc;
        if (uVar11 < 4) {
          uVar11 = *(ulong *)(&DAT_00680b68 + uVar11 * 8);
        }
        else {
          uVar11 = 0;
        }
        iVar3 = *(int *)&pQVar4[1].styleObject;
        if (iVar3 == 1) {
LAB_00354ad5:
          uVar11 = uVar11 | 0x200000;
        }
        else if (iVar3 == 2) {
LAB_00354ae1:
          uVar11 = uVar11 | 0x100000;
        }
        else if (iVar3 == 3) {
          uVar11 = uVar11 | 0x300000;
        }
      }
    }
    else {
      iVar3 = pQVar4[1].type;
      uVar11 = (ulong)(pQVar4[1].version == 1) << 0xf;
      if (iVar3 == 2) {
        uVar11 = uVar11 | 0x10000000;
      }
      else if (iVar3 == 1) {
        uVar11 = uVar11 | 0x8000000;
      }
      if (iVar3 != 0) {
        uVar7 = 0x4000000040;
        if ((char)pQVar4[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                  super_QFlagsStorage<QStyle::StateFlag>.i != '\0') {
          uVar7 = 0x2000000020;
        }
        uVar11 = uVar11 | uVar7;
      }
    }
    this_00 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
    if (this_00 == (QLineEdit *)0x0) {
      this_01 = (QFrame *)QMetaObject::cast((QObject *)&QFrame::staticMetaObject);
      if (this_01 != (QFrame *)0x0) {
        iVar3 = QFrame::lineWidth(this_01);
        if (iVar3 == 0) {
          uVar11 = uVar11 | 0x20000000;
        }
      }
    }
    else {
      state.i = state.i & 0xfffffffb;
      bVar2 = QLineEdit::hasFrame(this_00);
      if (bVar2) {
        uVar11 = uVar11 & 0xffffffffdfffffff;
      }
      else {
        uVar11 = uVar11 | 0x20000000;
      }
    }
    goto LAB_0035485c;
  }
  if (pseudoElement == 0) goto switchD_00354584_caseD_a;
  uVar6 = state.i & 0x181;
  if ((knownPseudoElements[pseudoElement].subControl & pQVar4[1].type) != SC_None) {
    uVar6 = state.i;
  }
  state.i = uVar6;
  switch(pseudoElement) {
  case 8:
  case 9:
    uVar10 = 0x2000020;
    goto LAB_0035479f;
  case 10:
  case 0x10:
    break;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar8 = opt, opt->type != 0xf0002)
       ) {
      pQVar8 = (QStyleOption *)0x0;
    }
    if (pQVar8 != (QStyleOption *)0x0) {
      uVar10 = 0x20;
      if ((pQVar8[1].direction & LayoutDirectionAuto) == LeftToRight) {
        uVar10 = 8;
      }
      if (pseudoElement - 0xbU < 2) {
        uVar10 = 8;
      }
      uVar9 = 0x20;
      if ((pQVar8[1].direction & RightToLeft) == LeftToRight) {
        uVar9 = uVar10;
      }
      if (1 < pseudoElement - 0xbU) {
        uVar9 = uVar10;
      }
      state.i = uVar6 | uVar9;
    }
    break;
  case 0xf:
    uVar10 = 0x2004;
LAB_0035479f:
    state.i = uVar6 | uVar10 & (pQVar4->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i;
    break;
  case 0x11:
  case 0x12:
  case 0x13:
    uVar10 = (pQVar4->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i;
    uVar6 = uVar10 & 0x2000 | uVar6;
    state.i = uVar6 | 4;
    if ((pQVar4[1].type & SC_ComboBoxEditField) == SC_None && (uVar10 & 4) == 0) {
      state.i = uVar6;
    }
    break;
  default:
    if (pseudoElement == 0x31) {
      uVar10 = 0x2000;
      goto LAB_0035479f;
    }
  }
switchD_00354584_caseD_a:
  if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar8 = opt, opt->type != 0xf0004))
  {
    pQVar8 = (QStyleOption *)0x0;
  }
  if (pQVar8 == (QStyleOption *)0x0) {
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar4 = opt, opt->type != 0xf0002)
       ) {
      pQVar4 = (QStyleOption *)0x0;
    }
    if (pQVar4 == (QStyleOption *)0x0) {
      if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
         (pQVar4 = opt, opt->type != 0xf0006)) {
        pQVar4 = (QStyleOption *)0x0;
      }
      if (pQVar4 == (QStyleOption *)0x0) {
        if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 0xf0005)) {
          opt = (QStyleOption *)0x0;
        }
        if (opt == (QStyleOption *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar6 = *(uint *)&opt[1].palette.d;
          if ((uVar6 & 1) == 0) {
            uVar11 = (ulong)(uVar6 & 2) << 0x23;
          }
          else {
            uVar11 = 0x800000000;
          }
        }
      }
      else {
        uVar7 = (ulong)((pQVar4[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                         super_QFlagsStorage<QStyle::StateFlag>.i & 1) << 0x16);
        uVar11 = uVar7 + 0x20000000;
        if (*(int *)((long)&pQVar4[1].styleObject + 4) != 0) {
          uVar11 = uVar7;
        }
      }
    }
    else {
      uVar11 = (ulong)(((byte)pQVar4[1].rect.x1.m_i ^ 1) << 0x1d);
    }
  }
  else {
    if ((pseudoElement == 0) && ((pQVar4[1].type & 2) != 0)) {
      state.i = state.i | ~state.i >> 0xb & 4;
    }
    uVar11 = (ulong)(((byte)pQVar8[1].rect.y2.m_i ^ 1) << 0x1d);
    if ((char)pQVar8[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i == '\0') {
      uVar11 = uVar11 | 0x40000000;
    }
    else {
      uVar11 = uVar11 | 0x8000000000;
    }
  }
LAB_0035485c:
  qVar5 = pseudoClass((State)state.i);
  renderRule(__return_storage_ptr__,this,obj,pseudoElement,uVar11 | qVar5);
  return __return_storage_ptr__;
}

Assistant:

QRenderRule QStyleSheetStyle::renderRule(const QObject *obj, const QStyleOption *opt, int pseudoElement) const
{
    quint64 extraClass = 0;
    QStyle::State state = opt ? opt->state : QStyle::State(QStyle::State_None);

    if (const QStyleOptionComplex *complex = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
        if (pseudoElement != PseudoElement_None) {
            // if not an active subcontrol, just pass enabled/disabled
            QStyle::SubControl subControl = knownPseudoElements[pseudoElement].subControl;

            if (!(complex->activeSubControls & subControl))
                state &= (QStyle::State_Enabled | QStyle::State_Horizontal | QStyle::State_HasFocus);
        }

        switch (pseudoElement) {
        case PseudoElement_ComboBoxDropDown:
        case PseudoElement_ComboBoxArrow:
            state |= (complex->state & (QStyle::State_On|QStyle::State_ReadOnly));
            break;
        case PseudoElement_SpinBoxUpButton:
        case PseudoElement_SpinBoxDownButton:
        case PseudoElement_SpinBoxUpArrow:
        case PseudoElement_SpinBoxDownArrow:
#if QT_CONFIG(spinbox)
            if (const QStyleOptionSpinBox *sb = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
                bool on = false;
                bool up = pseudoElement == PseudoElement_SpinBoxUpButton
                          || pseudoElement == PseudoElement_SpinBoxUpArrow;
                if ((sb->stepEnabled & QAbstractSpinBox::StepUpEnabled) && up)
                    on = true;
                else if ((sb->stepEnabled & QAbstractSpinBox::StepDownEnabled) && !up)
                    on = true;
                state |= (on ? QStyle::State_On : QStyle::State_Off);
            }
#endif // QT_CONFIG(spinbox)
            break;
        case PseudoElement_GroupBoxTitle:
            state |= (complex->state & (QStyle::State_MouseOver | QStyle::State_Sunken));
            break;
        case PseudoElement_ToolButtonMenu:
        case PseudoElement_ToolButtonMenuArrow:
        case PseudoElement_ToolButtonMenuIndicator:
            state |= complex->state & QStyle::State_MouseOver;
            if (complex->state & QStyle::State_Sunken ||
                complex->activeSubControls & QStyle::SC_ToolButtonMenu)
                state |= QStyle::State_Sunken;
            break;
        case PseudoElement_SliderGroove:
            state |= complex->state & QStyle::State_MouseOver;
            break;
        default:
            break;
        }

        if (const QStyleOptionComboBox *combo = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            // QStyle::State_On is set when the popup is being shown
            // Propagate EditField Pressed state
            if (pseudoElement == PseudoElement_None
                && (complex->activeSubControls & QStyle::SC_ComboBoxEditField)
                && (!(state & QStyle::State_MouseOver))) {
                state |= QStyle::State_Sunken;
            }

            if (!combo->frame)
                extraClass |= PseudoClass_Frameless;
            if (!combo->editable)
                extraClass |= PseudoClass_ReadOnly;
            else
                extraClass |= PseudoClass_Editable;
#if QT_CONFIG(spinbox)
        } else if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (!spin->frame)
                extraClass |= PseudoClass_Frameless;
#endif // QT_CONFIG(spinbox)
        } else if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            if (gb->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
            if (gb->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
        } else if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            if (tb->titleBarState & Qt::WindowMinimized) {
                extraClass |= PseudoClass_Minimized;
            }
            else if (tb->titleBarState & Qt::WindowMaximized)
                extraClass |= PseudoClass_Maximized;
        }
    } else {
        // handle simple style options
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            if (mi->menuItemType == QStyleOptionMenuItem::DefaultItem)
                extraClass |= PseudoClass_Default;
            if (mi->checkType == QStyleOptionMenuItem::Exclusive)
                extraClass |= PseudoClass_Exclusive;
            else if (mi->checkType == QStyleOptionMenuItem::NonExclusive)
                extraClass |= PseudoClass_NonExclusive;
            if (mi->checkType != QStyleOptionMenuItem::NotCheckable)
                extraClass |= (mi->checked) ? (PseudoClass_On|PseudoClass_Checked)
                                            : (PseudoClass_Off|PseudoClass_Unchecked);
        } else if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            if (hdr->position == QStyleOptionHeader::OnlyOneSection)
                extraClass |= PseudoClass_OnlyOne;
            else if (hdr->position == QStyleOptionHeader::Beginning)
                extraClass |= PseudoClass_First;
            else if (hdr->position == QStyleOptionHeader::End)
                extraClass |= PseudoClass_Last;
            else if (hdr->position == QStyleOptionHeader::Middle)
                extraClass |= PseudoClass_Middle;

            if (hdr->selectedPosition == QStyleOptionHeader::NextAndPreviousAreSelected)
                extraClass |= (PseudoClass_NextSelected | PseudoClass_PreviousSelected);
            else if (hdr->selectedPosition == QStyleOptionHeader::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (hdr->selectedPosition == QStyleOptionHeader::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
#if QT_CONFIG(tabwidget)
        } else if (const QStyleOptionTabWidgetFrame *tab = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif
#if QT_CONFIG(tabbar)
        } else if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
            if (tab->position == QStyleOptionTab::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tab->position == QStyleOptionTab::Beginning)
                extraClass |= PseudoClass_First;
            else if (tab->position == QStyleOptionTab::End)
                extraClass |= PseudoClass_Last;
            else if (tab->position == QStyleOptionTab::Middle)
                extraClass |= PseudoClass_Middle;

            if (tab->selectedPosition == QStyleOptionTab::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tab->selectedPosition == QStyleOptionTab::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;

            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif // QT_CONFIG(tabbar)
        } else if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::Flat)
                extraClass |= PseudoClass_Flat;
            if (btn->features & QStyleOptionButton::DefaultButton)
                extraClass |= PseudoClass_Default;
        } else if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (frm->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
            if (frm->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
        }
#if QT_CONFIG(toolbar)
        else if (const QStyleOptionToolBar *tb = qstyleoption_cast<const QStyleOptionToolBar *>(opt)) {
            if (tb->toolBarArea == Qt::LeftToolBarArea)
                extraClass |= PseudoClass_Left;
            else if (tb->toolBarArea == Qt::RightToolBarArea)
                extraClass |= PseudoClass_Right;
            else if (tb->toolBarArea == Qt::TopToolBarArea)
                extraClass |= PseudoClass_Top;
            else if (tb->toolBarArea == Qt::BottomToolBarArea)
                extraClass |= PseudoClass_Bottom;

            if (tb->positionWithinLine == QStyleOptionToolBar::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->positionWithinLine == QStyleOptionToolBar::Middle)
                extraClass |= PseudoClass_Middle;
            else if (tb->positionWithinLine == QStyleOptionToolBar::End)
                extraClass |= PseudoClass_Last;
            else if (tb->positionWithinLine == QStyleOptionToolBar::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
        }
#endif // QT_CONFIG(toolbar)
#if QT_CONFIG(toolbox)
        else if (const QStyleOptionToolBox *tb = qstyleoption_cast<const QStyleOptionToolBox *>(opt)) {
            if (tb->position == QStyleOptionToolBox::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tb->position == QStyleOptionToolBox::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->position == QStyleOptionToolBox::End)
                extraClass |= PseudoClass_Last;
            else if (tb->position == QStyleOptionToolBox::Middle)
                extraClass |= PseudoClass_Middle;

            if (tb->selectedPosition == QStyleOptionToolBox::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tb->selectedPosition == QStyleOptionToolBox::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
        }
#endif // QT_CONFIG(toolbox)
#if QT_CONFIG(dockwidget)
        else if (const QStyleOptionDockWidget *dw = qstyleoption_cast<const QStyleOptionDockWidget *>(opt)) {
            if (dw->verticalTitleBar)
                extraClass |= PseudoClass_Vertical;
            else
                extraClass |= PseudoClass_Horizontal;
            if (dw->closable)
                extraClass |= PseudoClass_Closable;
            if (dw->floatable)
                extraClass |= PseudoClass_Floatable;
            if (dw->movable)
                extraClass |= PseudoClass_Movable;
        }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(itemviews)
        else if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            if (vopt->features & QStyleOptionViewItem::Alternate)
                extraClass |= PseudoClass_Alternate;
            if (vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Beginning)
                extraClass |= PseudoClass_First;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::End)
                extraClass |= PseudoClass_Last;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Middle)
                extraClass |= PseudoClass_Middle;

        }
#endif
#if QT_CONFIG(textedit)
        else if (const QPlainTextEdit *edit = qobject_cast<const QPlainTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
        else if (const QTextEdit *edit = qobject_cast<const QTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
#endif
#if QT_CONFIG(lineedit)
        // LineEdit sets Sunken flag to indicate Sunken frame (argh)
        if (const QLineEdit *lineEdit = qobject_cast<const QLineEdit *>(obj)) {
            state &= ~QStyle::State_Sunken;
            if (lineEdit->hasFrame()) {
                extraClass &= ~PseudoClass_Frameless;
            } else {
                extraClass |= PseudoClass_Frameless;
            }
        } else
#endif
        if (const QFrame *frm = qobject_cast<const QFrame *>(obj)) {
            if (frm->lineWidth() == 0)
                extraClass |= PseudoClass_Frameless;
        }
    }

    return renderRule(obj, pseudoElement, pseudoClass(state) | extraClass);
}